

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadsavemenu.cpp
# Opt level: O1

void __thiscall DLoadSaveMenu::UnloadSaveData(DLoadSaveMenu *this)

{
  if (this->SavePic != (FTexture *)0x0) {
    (*this->SavePic->_vptr_FTexture[1])();
  }
  if (this->SaveComment != (FBrokenLines *)0x0) {
    V_FreeBrokenLines(this->SaveComment);
  }
  if (this->currentSavePic != (FileReader *)0x0) {
    (*(this->currentSavePic->super_FileReaderBase)._vptr_FileReaderBase[1])();
  }
  this->currentSavePic = (FileReader *)0x0;
  this->SavePic = (FTexture *)0x0;
  this->SaveComment = (FBrokenLines *)0x0;
  if ((this->SavePicData).Count != 0) {
    (this->SavePicData).Count = 0;
  }
  return;
}

Assistant:

void DLoadSaveMenu::UnloadSaveData ()
{
	if (SavePic != nullptr)
	{
		delete SavePic;
	}
	if (SaveComment != nullptr)
	{
		V_FreeBrokenLines (SaveComment);
	}
	if (currentSavePic != nullptr)
	{
		delete currentSavePic;
	}

	SavePic = nullptr;
	SaveComment = nullptr;
	currentSavePic = nullptr;
	SavePicData.Clear();
}